

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uri.cpp
# Opt level: O1

string * __thiscall
Uri::Uri::makeFsPath_abi_cxx11_(string *__return_storage_ptr__,Uri *this,Uri *uri)

{
  char *pcVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((this->authority)._M_string_length == 0) || ((this->path)._M_string_length < 2)) {
LAB_0018934b:
    if ((1 < (this->path)._M_string_length) &&
       (pcVar1 = (this->path)._M_dataplus._M_p, *pcVar1 == '/')) {
      iVar2 = isalpha((int)pcVar1[1]);
      if ((iVar2 != 0) && (pcVar1[2] == ':')) {
        tolower((int)pcVar1[1]);
        std::__cxx11::string::substr((ulong)&local_68,(ulong)&this->path);
        plVar3 = (long *)std::__cxx11::string::insert((ulong)&local_68,0,'\x01');
        goto LAB_001893ea;
      }
    }
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&this->scheme);
    if (iVar2 != 0) goto LAB_0018934b;
    std::operator+(&local_68,"//",&this->authority);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_68,(ulong)(this->path)._M_dataplus._M_p);
LAB_001893ea:
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_38 = *plVar4;
      lStack_30 = plVar3[3];
      local_48 = &local_38;
    }
    else {
      local_38 = *plVar4;
      local_48 = (long *)*plVar3;
    }
    local_40 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48,local_38 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string Uri::makeFsPath (const Uri &uri) {
    string value {};

    if (!uri.authority.empty() && uri.path.length() > 1 && uri.scheme == "file") {
        value = "//" + uri.authority + uri.path;
    } else if (
            uri.path.length() >= 2
            && uri.path[0] == CharCode::Slash
            && std::isalpha(uri.path[1])
            && uri.path[2] == CharCode::Colon
            ) {
        value = static_cast<char>(std::tolower(uri.path[1])) + uri.path.substr(2);
    } else {
        value = uri.path;
    }

    if (IS_WINDOWS) {
        forwardToBackslashes(value);
    }

    return value;
}